

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_select_node.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::PlanFilter
          (Binder *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *condition,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root)

{
  element_type *this_00;
  pointer this_01;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RCX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_38;
  _Head_base<0UL,_duckdb::LogicalFilter_*,_false> local_30;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_28;
  
  PlanSubqueries((Binder *)condition,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 root,in_RCX);
  this_00 = (element_type *)operator_new(0x80);
  local_28._M_head_impl =
       (root->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (root->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  LogicalFilter::LogicalFilter
            ((LogicalFilter *)this_00,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_28);
  local_30._M_head_impl = (LogicalFilter *)this_00;
  if (local_28._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_28._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  this_01 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>::
            operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                        *)&local_30);
  local_38._M_head_impl =
       (in_RCX->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (in_RCX->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  LogicalOperator::AddChild
            (&this_01->super_LogicalOperator,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_38);
  if (local_38._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_38._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::PlanFilter(unique_ptr<Expression> condition, unique_ptr<LogicalOperator> root) {
	PlanSubqueries(condition, root);
	auto filter = make_uniq<LogicalFilter>(std::move(condition));
	filter->AddChild(std::move(root));
	return std::move(filter);
}